

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

string * __thiscall
cmsys::SystemTools::EscapeChars_abi_cxx11_
          (string *__return_storage_ptr__,SystemTools *this,char *str,char *chars_to_escape,
          char escape_char)

{
  char *local_40;
  char *ptr;
  char escape_char_local;
  char *chars_to_escape_local;
  char *str_local;
  string *n;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (this != (SystemTools *)0x0) {
    if ((str == (char *)0x0) || (*str == '\0')) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
      strlen((char *)this);
      std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
      for (chars_to_escape_local = (char *)this; local_40 = str, *chars_to_escape_local != '\0';
          chars_to_escape_local = chars_to_escape_local + 1) {
        for (; *local_40 != '\0'; local_40 = local_40 + 1) {
          if (*chars_to_escape_local == *local_40) {
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(char)chars_to_escape)
            ;
            break;
          }
        }
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*chars_to_escape_local);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SystemTools::EscapeChars(
  const char *str,
  const char *chars_to_escape,
  char escape_char)
{
  std::string n;
  if (str)
    {
    if (!chars_to_escape || !*chars_to_escape)
      {
      n.append(str);
      }
    else
      {
      n.reserve(strlen(str));
      while (*str)
        {
        const char *ptr = chars_to_escape;
        while (*ptr)
          {
          if (*str == *ptr)
            {
            n += escape_char;
            break;
            }
          ++ptr;
          }
        n += *str;
        ++str;
        }
      }
    }
  return n;
}